

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::KillObjectType
          (GlobOpt *this,StackSym *objectSym,BVSparse<Memory::JitArenaAllocator> *liveFields)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  StackSym *auxSlotPtrSym;
  BVSparse<Memory::JitArenaAllocator> *liveFields_local;
  StackSym *objectSym_local;
  GlobOpt *this_local;
  
  bVar2 = StackSym::IsTypeSpec(objectSym);
  liveFields_local = (BVSparse<Memory::JitArenaAllocator> *)objectSym;
  if (bVar2) {
    liveFields_local =
         (BVSparse<Memory::JitArenaAllocator> *)StackSym::GetVarEquivSym(objectSym,this->func);
  }
  if (liveFields_local == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x780,"(objectSym)","objectSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = StackSym::HasObjectTypeSym((StackSym *)liveFields_local);
  if (bVar2) {
    auxSlotPtrSym = (StackSym *)liveFields;
    if (liveFields == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      auxSlotPtrSym = (StackSym *)(this->currentBlock->globOptData).liveFields;
    }
    pSVar4 = StackSym::GetObjectTypeSym((StackSym *)liveFields_local);
    BVSparse<Memory::JitArenaAllocator>::Clear
              ((BVSparse<Memory::JitArenaAllocator> *)auxSlotPtrSym,(pSVar4->super_Sym).m_id);
    pSVar4 = StackSym::GetAuxSlotPtrSym((StackSym *)liveFields_local);
    if (pSVar4 != (StackSym *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                ((BVSparse<Memory::JitArenaAllocator> *)auxSlotPtrSym,(pSVar4->super_Sym).m_id);
    }
  }
  return;
}

Assistant:

void
GlobOpt::KillObjectType(StackSym* objectSym, BVSparse<JitArenaAllocator>* liveFields)
{
    if (objectSym->IsTypeSpec())
    {
        objectSym = objectSym->GetVarEquivSym(this->func);
    }

    Assert(objectSym);

    // We may be conservatively attempting to kill type syms from object syms that don't actually
    // participate in object type specialization and hence don't actually have type syms (yet).
    if (!objectSym->HasObjectTypeSym())
    {
        return;
    }

    if (liveFields == nullptr)
    {
        liveFields = this->currentBlock->globOptData.liveFields;
    }

    liveFields->Clear(objectSym->GetObjectTypeSym()->m_id);
    StackSym *auxSlotPtrSym = objectSym->GetAuxSlotPtrSym();
    if (auxSlotPtrSym)
    {
        liveFields->Clear(auxSlotPtrSym->m_id);
    }
}